

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cipher_aes_ccm.c
# Opt level: O0

void * aes_ccm_newctx(void *provctx,size_t keybits)

{
  int iVar1;
  PROV_CCM_CTX *ctx_00;
  PROV_CCM_HW *hw;
  size_t in_RSI;
  PROV_AES_CCM_CTX *ctx;
  undefined8 in_stack_ffffffffffffffd0;
  char *in_stack_ffffffffffffffd8;
  size_t in_stack_ffffffffffffffe0;
  undefined8 local_8;
  
  iVar1 = ossl_prov_is_running();
  if (iVar1 == 0) {
    local_8 = (PROV_CCM_CTX *)0x0;
  }
  else {
    ctx_00 = (PROV_CCM_CTX *)
             CRYPTO_zalloc(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,
                           (int)((ulong)in_stack_ffffffffffffffd0 >> 0x20));
    local_8 = ctx_00;
    if (ctx_00 != (PROV_CCM_CTX *)0x0) {
      hw = ossl_prov_aes_hw_ccm(in_RSI);
      ossl_ccm_initctx(ctx_00,in_RSI,hw);
    }
  }
  return local_8;
}

Assistant:

static void *aes_ccm_newctx(void *provctx, size_t keybits)
{
    PROV_AES_CCM_CTX *ctx;

    if (!ossl_prov_is_running())
        return NULL;

    ctx = OPENSSL_zalloc(sizeof(*ctx));
    if (ctx != NULL)
        ossl_ccm_initctx(&ctx->base, keybits, ossl_prov_aes_hw_ccm(keybits));
    return ctx;
}